

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::DepthGradientShader::shadeFragments
          (DepthGradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float f0;
  float y;
  float x;
  Vec4 coord;
  int fragNdx;
  int packetNdx;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 color;
  float gradientMax;
  float gradientMin;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  DepthGradientShader *this_local;
  
  fVar1 = (this->u_minGradient->value).f;
  fVar2 = (this->u_maxGradient->value).f;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(icolor.m_data + 2),(float (*) [4])&this->u_color->value);
  castVectorSaturate<int>((FboTestUtil *)(uicolor.m_data + 2),(Vec4 *)(icolor.m_data + 2));
  castVectorSaturate<unsigned_int>((FboTestUtil *)&fragNdx,(Vec4 *)(icolor.m_data + 2));
  for (coord.m_data[3] = 0.0; (int)coord.m_data[3] < numPackets;
      coord.m_data[3] = (float)((int)coord.m_data[3] + 1)) {
    for (coord.m_data[2] = 0.0; (int)coord.m_data[2] < 4;
        coord.m_data[2] = (float)((int)coord.m_data[2] + 1)) {
      rr::readTriangleVarying<float>
                ((rr *)&y,packets + (int)coord.m_data[3],context,0,(int)coord.m_data[2]);
      fVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&y);
      fVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&y);
      rr::writeFragmentDepth
                (context,(int)coord.m_data[3],(int)coord.m_data[2],0,
                 (fVar2 - fVar1) * (fVar3 + fVar4) * 0.5 + fVar1);
      if (*(int *)&(this->super_ShaderProgram).field_0x154 == 4) {
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (context,(int)coord.m_data[3],(int)coord.m_data[2],0,
                   (Vector<float,_4> *)(icolor.m_data + 2));
      }
      else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 0x1e) {
        rr::writeFragmentOutput<tcu::Vector<int,4>>
                  (context,(int)coord.m_data[3],(int)coord.m_data[2],0,
                   (Vector<int,_4> *)(uicolor.m_data + 2));
      }
      else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 0x22) {
        rr::writeFragmentOutput<tcu::Vector<unsigned_int,4>>
                  (context,(int)coord.m_data[3],(int)coord.m_data[2],0,
                   (Vector<unsigned_int,_4> *)&fragNdx);
      }
    }
  }
  return;
}

Assistant:

void DepthGradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const float			gradientMin	(u_minGradient.value.f);
	const float			gradientMax	(u_maxGradient.value.f);
	const tcu::Vec4		color		(u_color.value.f4);
	const tcu::IVec4	icolor		(castVectorSaturate<deInt32>(color));
	const tcu::UVec4	uicolor		(castVectorSaturate<deUint32>(color));

	// running this shader without a depth buffer does not make any sense
	DE_ASSERT(context.fragmentDepths);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;

		rr::writeFragmentDepth(context, packetNdx, fragNdx, 0, gradientMin + (gradientMax-gradientMin) * f0);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}